

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O3

int fast_relay_test(int mode)

{
  condition_variable *this;
  double dVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int __how;
  TaskResult *ret;
  TaskResult *ret_00;
  TaskResult *extraout_RDX;
  int __fd;
  ThreadPoolMgr *pTVar5;
  undefined1 auVar6 [16];
  FastRelayCtx relay_ctx;
  ThreadPoolMgr mgr;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined2 local_2b0;
  FastRelayCtx local_2a8;
  ThreadPoolMgr local_210;
  
  local_2b8 = 100;
  local_2b0 = 0x100;
  local_2c0 = 2;
  if (mode == 1) {
    local_2b0 = 0;
  }
  simple_thread_pool::ThreadPoolMgr::ThreadPoolMgr(&local_210);
  simple_thread_pool::ThreadPoolMgr::init(&local_210,(EVP_PKEY_CTX *)&local_2c0);
  TestSuite::_msgt("begin\n");
  lVar2 = std::chrono::_V2::system_clock::now();
  local_2a8.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8.storage._M_t._M_impl.super__Rb_tree_header._M_header;
  local_2a8.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8.storage._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8.asyncScheduleNext = true;
  local_2a8.ea.status._M_i = idle;
  local_2a8.ea.cvLock.super___mutex_base._M_mutex.__align = 0;
  local_2a8.ea.cvLock.super___mutex_base._M_mutex._8_8_ = 0;
  local_2a8.ea.cvLock.super___mutex_base._M_mutex._16_8_ = 0;
  local_2a8.ea.cvLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_2a8.ea.cvLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this = &local_2a8.ea.cv;
  local_2a8.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::condition_variable::condition_variable(this);
  if (mode == 0) {
    local_2a8.asyncScheduleNext = false;
    lVar3 = 1000000;
    ret_00 = ret;
    do {
      pTVar5 = &local_210;
      fast_relay_func(&local_2a8,&local_210,ret_00);
      __fd = (int)pTVar5;
      lVar3 = lVar3 + -1;
      ret_00 = extraout_RDX;
    } while (lVar3 != 0);
  }
  else {
    fast_relay_func(&local_2a8,&local_210,ret);
    __fd = 3000000;
    simple_thread_pool::EventAwaiter::wait_us(&local_2a8.ea,3000000);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  dVar1 = ((double)(lVar3 - lVar2) / 1000000000.0) * 1000000.0;
  uVar4 = (ulong)dVar1;
  uVar4 = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
  auVar6._8_4_ = (int)(uVar4 >> 0x20);
  auVar6._0_8_ = uVar4;
  auVar6._12_4_ = 0x45300000;
  TestSuite::_msgt("%.1f executions/s",
                   SUB84(((((double)CONCAT44(0x45300000,
                                             (int)(local_2a8.storage._M_t._M_impl.
                                                   super__Rb_tree_header._M_node_count >> 0x20)) -
                           1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,
                                            (int)local_2a8.storage._M_t._M_impl.
                                                 super__Rb_tree_header._M_node_count) -
                          4503599627370496.0)) * 1000000.0) /
                         ((auVar6._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)),0));
  simple_thread_pool::ThreadPoolMgr::shutdown(&local_210,__fd,__how);
  std::condition_variable::~condition_variable(this);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)&local_2a8);
  simple_thread_pool::ThreadPoolMgr::~ThreadPoolMgr(&local_210);
  return 0;
}

Assistant:

int fast_relay_test(int mode) {
    ThreadPoolOptions opt;
    opt.numInitialThreads = 2;
    if (mode == 1) {
        opt.activeWorkerMode = false;
    } else if (mode == 2) {
        opt.activeWorkerMode = true;
    }

    // Initialize thread pool.
    ThreadPoolMgr mgr;
    mgr.init(opt);

    TestSuite::_msgt("begin\n");
    TestSuite::Timer tt;

    FastRelayCtx relay_ctx;
    if (mode == 0) {
        relay_ctx.asyncScheduleNext = false;
        for (size_t ii = 0; ii < 1000000; ++ii) {
            fast_relay_func(&relay_ctx, &mgr, TaskResult());
        }
    } else {
        // Fire timer task.
        fast_relay_func(&relay_ctx, &mgr, TaskResult());
        // Wait 3 seconds.
        relay_ctx.ea.wait_ms(3000);
    }

    uint64_t elapsed_us = tt.getTimeUs();
    TestSuite::_msgt("%.1f executions/s",
                     relay_ctx.storage.size() * 1000000.0 / elapsed_us);

    // Shutdown thread pool.
    mgr.shutdown();
    return 0;
}